

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_clear(nk_context *ctx)

{
  nk_window *pnVar1;
  nk_page_element *pnVar2;
  nk_size in_RDX;
  nk_size extraout_RDX;
  nk_page_element *elem;
  nk_window *win;
  nk_page_element *pe;
  
  if (ctx != (nk_context *)0x0) {
    if (ctx->use_pool == 0) {
      nk_buffer_reset(&ctx->memory,NK_BUFFER_FRONT);
      in_RDX = extraout_RDX;
    }
    else {
      (ctx->memory).allocated = 0;
      (ctx->memory).needed = 0;
      (ctx->memory).size = (ctx->memory).memory.size;
    }
    ctx->build = 0;
    (ctx->memory).calls = 0;
    ctx->last_widget_state = 0;
    (ctx->style).cursor_active = (ctx->style).cursors[0];
    nk_memset(&ctx->overlay,0x40,in_RDX);
    win = ctx->begin;
    while (win != (nk_window *)0x0) {
      if ((win->flags & 0x4000) == 0) {
        pnVar1 = (win->popup).win;
        if ((pnVar1 != (nk_window *)0x0) && (pnVar1->seq != ctx->seq)) {
          nk_free_window(ctx,pnVar1);
          (win->popup).win = (nk_window *)0x0;
        }
        pnVar2 = (nk_page_element *)win->tables;
        while (elem = pnVar2, elem != (nk_page_element *)0x0) {
          pnVar2 = (nk_page_element *)(elem->data).tbl.next;
          if ((elem->data).tbl.seq != ctx->seq) {
            nk_remove_table(win,(nk_table *)elem);
            nk_zero(elem,0x1b8);
            nk_free_page_element(ctx,elem);
            if (elem == (nk_page_element *)win->tables) {
              win->tables = (nk_table *)pnVar2;
            }
          }
        }
        if ((win->seq == ctx->seq) && ((win->flags & 0x2000) == 0)) goto LAB_0010e97d;
        pnVar1 = win->next;
        nk_remove_window(ctx,win);
        nk_free_window(ctx,win);
        win = pnVar1;
      }
      else {
LAB_0010e97d:
        win = win->next;
      }
    }
    ctx->seq = ctx->seq + 1;
  }
  return;
}

Assistant:

NK_API void
nk_clear(struct nk_context *ctx)
{
    struct nk_window *iter;
    struct nk_window *next;
    NK_ASSERT(ctx);

    if (!ctx) return;
    if (ctx->use_pool)
        nk_buffer_clear(&ctx->memory);
    else nk_buffer_reset(&ctx->memory, NK_BUFFER_FRONT);

    ctx->build = 0;
    ctx->memory.calls = 0;
    ctx->last_widget_state = 0;
    ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    NK_MEMSET(&ctx->overlay, 0, sizeof(ctx->overlay));
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
    nk_draw_list_clear(&ctx->draw_list);
#endif

    /* garbage collector */
    iter = ctx->begin;
    while (iter) {
        /* make sure minimized windows do not get removed */
        if (iter->flags & NK_WINDOW_MINIMIZED) {
            iter = iter->next;
            continue;
        }

        /* free unused popup windows */
        if (iter->popup.win && iter->popup.win->seq != ctx->seq) {
            nk_free_window(ctx, iter->popup.win);
            iter->popup.win = 0;
        }

        /* remove unused window state tables */
        {struct nk_table *n, *it = iter->tables;
        while (it) {
            n = it->next;
            if (it->seq != ctx->seq) {
                nk_remove_table(iter, it);
                nk_zero(it, sizeof(union nk_page_data));
                nk_free_table(ctx, it);
                if (it == iter->tables)
                    iter->tables = n;
            }
            it = n;
        }}

        /* window itself is not used anymore so free */
        if (iter->seq != ctx->seq || iter->flags & NK_WINDOW_CLOSED) {
            next = iter->next;
            nk_remove_window(ctx, iter);
            nk_free_window(ctx, iter);
            iter = next;
        } else iter = iter->next;
    }
    ctx->seq++;
}